

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-make.c
# Opt level: O0

void init_race_allocs(void)

{
  wchar_t wVar1;
  int iVar2;
  short *p_00;
  void *p_01;
  alloc_entry *paVar3;
  int local_44;
  wchar_t race_index;
  wchar_t prev_lev_count;
  wchar_t lev;
  wchar_t p;
  int16_t *already_counted;
  int16_t *num;
  alloc_entry *table;
  monster_race *race;
  wchar_t i;
  
  p_00 = (short *)mem_zalloc((ulong)z_info->max_depth << 1);
  p_01 = mem_zalloc((ulong)z_info->max_depth << 1);
  alloc_race_size = 0;
  for (race._4_4_ = 1; race._4_4_ < (int)(z_info->r_max - 1); race._4_4_ = race._4_4_ + 1) {
    if (r_info[race._4_4_].rarity != L'\0') {
      alloc_race_size = alloc_race_size + 1;
      p_00[r_info[race._4_4_].level] = p_00[r_info[race._4_4_].level] + 1;
    }
  }
  for (race._4_4_ = 1; race._4_4_ < (int)(uint)z_info->max_depth; race._4_4_ = race._4_4_ + 1) {
    p_00[race._4_4_] = p_00[race._4_4_] + p_00[race._4_4_ + -1];
  }
  if (*p_00 == 0) {
    quit("No town monsters!");
  }
  paVar3 = (alloc_entry *)mem_zalloc((long)alloc_race_size * 0x14);
  alloc_race_table = paVar3;
  for (race._4_4_ = 1; race._4_4_ < (int)(z_info->r_max - 1); race._4_4_ = race._4_4_ + 1) {
    if (r_info[race._4_4_].rarity != L'\0') {
      wVar1 = r_info[race._4_4_].level;
      iVar2 = (wVar1 / 10 + 1) * (int)(100 / (long)r_info[race._4_4_].rarity);
      if (wVar1 < L'\x01') {
        local_44 = 0;
      }
      else {
        local_44 = (int)p_00[wVar1 + L'\xffffffff'];
      }
      local_44 = local_44 + *(short *)((long)p_01 + (long)wVar1 * 2);
      paVar3[local_44].index = race._4_4_;
      paVar3[local_44].level = wVar1;
      paVar3[local_44].prob1 = iVar2;
      paVar3[local_44].prob2 = iVar2;
      paVar3[local_44].prob3 = iVar2;
      *(short *)((long)p_01 + (long)wVar1 * 2) = *(short *)((long)p_01 + (long)wVar1 * 2) + 1;
    }
  }
  mem_free(p_01);
  mem_free(p_00);
  return;
}

Assistant:

static void init_race_allocs(void) {
	int i;
	struct monster_race *race;
	alloc_entry *table;
	int16_t *num = mem_zalloc(z_info->max_depth * sizeof(int16_t));
	int16_t *already_counted =
		mem_zalloc(z_info->max_depth * sizeof(int16_t));

	/* Size of "alloc_race_table" */
	alloc_race_size = 0;

	/* Scan the monsters (not the ghost) */
	for (i = 1; i < z_info->r_max - 1; i++) {
		/* Get the i'th race */
		race = &r_info[i];

		/* Legal monsters */
		if (race->rarity) {
			/* Count the entries */
			alloc_race_size++;

			/* Group by level */
			num[race->level]++;
		}
	}

	/* Calculate the cumultive level totals */
	for (i = 1; i < z_info->max_depth; i++) {
		/* Group by level */
		num[i] += num[i - 1];
	}

	/* Paranoia */
	if (!num[0]) quit("No town monsters!");

	/* Allocate the alloc_race_table */
	alloc_race_table = mem_zalloc(alloc_race_size * sizeof(alloc_entry));

	/* Get the table entry */
	table = alloc_race_table;

	/* Scan the monsters (not the ghost) */
	for (i = 1; i < z_info->r_max - 1; i++) {
		/* Get the i'th race */
		race = &r_info[i];

		/* Count valid races */
		if (race->rarity) {
			int p, lev, prev_lev_count, race_index;

			/* Extract this race's level */
			lev = race->level;

			/* Extract the base probability */
			p = (100 / race->rarity);

			/* Multiply by depth factor (experimental) */
			p *= (1 + lev / 10);

			/* Skip entries preceding this monster's level */
			prev_lev_count = (lev > 0) ? num[lev - 1] : 0;

			/* Skip entries already counted for this level */
			race_index = prev_lev_count + already_counted[lev];

			/* Load the entry */
			table[race_index].index = i;
			table[race_index].level = lev;
			table[race_index].prob1 = p;
			table[race_index].prob2 = p;
			table[race_index].prob3 = p;

			/* Another entry complete for this locale */
			already_counted[lev]++;
		}
	}
	mem_free(already_counted);
	mem_free(num);
}